

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void emit_FARRAY_SETF(function *fn,int A,int B,int C,_Bool known_int,int pc)

{
  int pc_local;
  _Bool known_int_local;
  int C_local;
  int B_local;
  int A_local;
  function *fn_local;
  
  emit_reg(fn,"ra",A);
  emit_reg_or_k(fn,"rb",B);
  emit_reg_or_k(fn,"rc",C);
  membuff_add_string(&fn->body,"t = arrvalue(ra);\n");
  membuff_add_string(&fn->body,"ukey = (lua_Unsigned)(ivalue(rb));\n");
  membuff_add_string(&fn->body,"nptr = (lua_Number *)t->data;\n");
  membuff_add_string(&fn->body,"if (ukey < (lua_Unsigned)(t->len)) {\n");
  membuff_add_string(&fn->body," nptr[ukey] = fltvalue(rc);\n");
  membuff_add_string(&fn->body,"} else {\n");
  membuff_add_fstring(&fn->body," raviH_set_float(L, t, ukey, fltvalue(rc));\n");
  membuff_add_string(&fn->body,"}\n");
  return;
}

Assistant:

static void emit_FARRAY_SETF(struct function *fn, int A, int B, int C, bool known_int, int pc) {
  (void)pc;
  (void)known_int;
  emit_reg(fn, "ra", A);
  emit_reg_or_k(fn, "rb", B);
  emit_reg_or_k(fn, "rc", C);
  membuff_add_string(&fn->body, "t = arrvalue(ra);\n");
  membuff_add_string(&fn->body, "ukey = (lua_Unsigned)(ivalue(rb));\n");
  membuff_add_string(&fn->body, "nptr = (lua_Number *)t->data;\n");
  membuff_add_string(&fn->body, "if (ukey < (lua_Unsigned)(t->len)) {\n");
  membuff_add_string(&fn->body, " nptr[ukey] = fltvalue(rc);\n");
  membuff_add_string(&fn->body, "} else {\n");
  membuff_add_fstring(&fn->body, " raviH_set_float(L, t, ukey, fltvalue(rc));\n");
  membuff_add_string(&fn->body, "}\n");
}